

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StartResumeReliablePdu.cpp
# Opt level: O0

void __thiscall DIS::StartResumeReliablePdu::StartResumeReliablePdu(StartResumeReliablePdu *this)

{
  StartResumeReliablePdu *this_local;
  
  SimulationManagementWithReliabilityFamilyPdu::SimulationManagementWithReliabilityFamilyPdu
            (&this->super_SimulationManagementWithReliabilityFamilyPdu);
  (this->super_SimulationManagementWithReliabilityFamilyPdu).super_Pdu.super_PduSuperclass.
  _vptr_PduSuperclass = (_func_int **)&PTR__StartResumeReliablePdu_002691c8;
  ClockTime::ClockTime(&this->_realWorldTime);
  ClockTime::ClockTime(&this->_simulationTime);
  this->_requiredReliabilityService = '\0';
  this->_pad1 = 0;
  this->_pad2 = '\0';
  this->_requestID = 0;
  PduSuperclass::setPduType((PduSuperclass *)this,'5');
  return;
}

Assistant:

StartResumeReliablePdu::StartResumeReliablePdu() : SimulationManagementWithReliabilityFamilyPdu(),
   _realWorldTime(), 
   _simulationTime(), 
   _requiredReliabilityService(0), 
   _pad1(0), 
   _pad2(0), 
   _requestID(0)
{
    setPduType( 53 );
}